

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O3

void re2::RegexpBigRef(void)

{
  Regexp *this;
  int iVar1;
  LogMessage local_190;
  
  local_190._0_8_ = "x";
  local_190._8_4_ = 1;
  this = Regexp::Parse((StringPiece *)&local_190,NoParseFlags,(RegexpStatus *)0x0);
  iVar1 = 100000;
  do {
    Regexp::Incref(this);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 100000;
  do {
    Regexp::Decref(this);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = Regexp::Ref(this);
  if (iVar1 != 1) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x16,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_190 + 8),"Check failed: (re->Ref()) == (1)",0x20);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  Regexp::Decref(this);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}